

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# monotone_partitioning.cc
# Opt level: O0

uint32_t __thiscall
PolygonTriangulation::find_top_inside_trapezoid_index(PolygonTriangulation *this)

{
  bool bVar1;
  size_type sVar2;
  const_reference trapezoid_00;
  value_type *trapezoid;
  uint32_t i;
  PolygonTriangulation *this_local;
  
  trapezoid._4_4_ = 0;
  while( true ) {
    sVar2 = std::
            vector<PolygonTriangulation::Trapezoid_t,_std::allocator<PolygonTriangulation::Trapezoid_t>_>
            ::size(&this->trapezoids_);
    if (sVar2 <= trapezoid._4_4_) {
      return 0xffffffff;
    }
    trapezoid_00 = std::
                   vector<PolygonTriangulation::Trapezoid_t,_std::allocator<PolygonTriangulation::Trapezoid_t>_>
                   ::operator[](&this->trapezoids_,(ulong)trapezoid._4_4_);
    bVar1 = is_top_inside_triangle(this,trapezoid_00);
    if (bVar1) break;
    trapezoid._4_4_ = trapezoid._4_4_ + 1;
  }
  return trapezoid._4_4_;
}

Assistant:

uint32_t PolygonTriangulation::find_top_inside_trapezoid_index() const {
  /// @bug : currently outside top triangle can be returned.
  for (uint32_t i = 0u; i < trapezoids_.size(); ++i) {
    const auto& trapezoid = trapezoids_[i];
    if (is_top_inside_triangle(trapezoid)) {
      return i;
    }
  }
  return kInvalidIndex;
}